

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O2

errno_t memset_s(void *dest,rsize_t len,uint8_t value)

{
  long lVar1;
  errno_t error;
  errno_t eVar2;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (void *)0x0) {
    msg = "memset_s: dest is null";
    eVar2 = 400;
    error = 400;
  }
  else if (len == 0) {
    msg = "memset_s: len is 0";
    eVar2 = 0x191;
    error = 0x191;
  }
  else {
    if (len < 0x10000001) {
      mem_prim_set(dest,(uint32_t)len,value);
      eVar2 = 0;
      goto LAB_00103950;
    }
    msg = "memset_s: len exceeds max";
    eVar2 = 0x193;
    error = 0x193;
  }
  invoke_safe_mem_constraint_handler(msg,(void *)0x0,error);
LAB_00103950:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar2;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memset_s (void *dest, rsize_t len, uint8_t value)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memset_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (len == 0) {
        invoke_safe_mem_constraint_handler("memset_s: len is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (len > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memset_s: len exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    mem_prim_set(dest, len, value);

    return (RCNEGATE(EOK));
}